

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int array_run_container_intersection_cardinality(array_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  int iVar2;
  int32_t length;
  rle16_t *prVar3;
  long lVar4;
  _Bool _Var5;
  int pos;
  ushort uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint16_t min;
  bool bVar10;
  
  _Var5 = run_container_is_full(src_2);
  if (_Var5) {
    iVar8 = src_1->cardinality;
  }
  else {
    iVar2 = src_2->n_runs;
    if (iVar2 == 0) {
      iVar8 = 0;
    }
    else {
      prVar3 = src_2->runs;
      min = prVar3->value;
      uVar6 = prVar3->length;
      length = src_1->cardinality;
      lVar9 = 0;
      pos = 0;
      iVar8 = 0;
      while (pos < length) {
        uVar1 = src_1->array[pos];
        iVar7 = (int)lVar9;
        lVar9 = (long)iVar7;
        iVar7 = (iVar2 + -1) - iVar7;
        while ((uint)uVar6 + (uint)min < (uint)uVar1) {
          bVar10 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          if (bVar10) {
            return iVar8;
          }
          min = prVar3[lVar9 + 1].value;
          lVar4 = lVar9 + 1;
          lVar9 = lVar9 + 1;
          uVar6 = prVar3[lVar4].length;
        }
        if (uVar1 < min) {
          pos = advanceUntil(src_1->array,pos,length,min);
        }
        else {
          iVar8 = iVar8 + 1;
          pos = pos + 1;
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int array_run_container_intersection_cardinality(const array_container_t *src_1,
                                                 const run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return src_1->cardinality;
    }
    if (src_2->n_runs == 0) {
        return 0;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return newcard;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            newcard++;
            arraypos++;
        }
    }
    return newcard;
}